

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createLifetimeEnd(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  long lVar2;
  PSNode *op1;
  PSNode *local_10;
  
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    lVar2 = (long)Inst - (ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    lVar2 = *(long *)(Inst + -8);
  }
  local_10 = getOperand(this,*(Value **)(lVar2 + 0x20));
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)17,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_10);
  return pPVar1;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createLifetimeEnd(const llvm::Instruction *Inst) {
    PSNode *op1 = getOperand(Inst->getOperand(1));
    return PS.create<PSNodeType::INVALIDATE_OBJECT>(op1);
}